

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_logger.cpp
# Opt level: O2

void __thiscall juzzlin::SimpleLogger::Impl::Impl(Impl *this)

{
  this->m_activeLevel = Info;
  (this->m_lock)._M_device = (mutex_type *)m_mutex;
  std::recursive_mutex::lock((recursive_mutex *)m_mutex);
  (this->m_tag)._M_dataplus._M_p = (pointer)&(this->m_tag).field_2;
  (this->m_tag)._M_string_length = 0;
  (this->m_tag).field_2._M_local_buf[0] = '\0';
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&this->m_message);
  return;
}

Assistant:

SimpleLogger::Impl::Impl()
  : m_lock(m_mutex)
{
}